

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmTarget.cxx
# Opt level: O1

void __thiscall cmTarget::CheckProperty(cmTarget *this,string *prop,cmMakefile *context)

{
  bool bVar1;
  int iVar2;
  char *pcVar3;
  ostream *poVar4;
  ostringstream e;
  string local_1b0;
  undefined1 local_190 [376];
  
  iVar2 = strncmp((prop->_M_dataplus)._M_p,"LINK_INTERFACE_LIBRARIES",0x18);
  if (iVar2 == 0) {
    pcVar3 = GetProperty(this,prop);
    if (pcVar3 != (char *)0x0) {
      cmTargetCheckLINK_INTERFACE_LIBRARIES(prop,pcVar3,context,false);
    }
  }
  iVar2 = strncmp((prop->_M_dataplus)._M_p,"IMPORTED_LINK_INTERFACE_LIBRARIES",0x21);
  if (iVar2 == 0) {
    pcVar3 = GetProperty(this,prop);
    if (pcVar3 != (char *)0x0) {
      cmTargetCheckLINK_INTERFACE_LIBRARIES(prop,pcVar3,context,true);
    }
  }
  iVar2 = strncmp((prop->_M_dataplus)._M_p,"INTERFACE_LINK_LIBRARIES",0x18);
  if (iVar2 == 0) {
    pcVar3 = GetProperty(this,prop);
    if (pcVar3 != (char *)0x0) {
      if (cmTargetCheckINTERFACE_LINK_LIBRARIES(char_const*,cmMakefile*)::keys == '\0') {
        iVar2 = __cxa_guard_acquire(&cmTargetCheckINTERFACE_LINK_LIBRARIES(char_const*,cmMakefile*)
                                     ::keys);
        if (iVar2 != 0) {
          cmTargetCheckINTERFACE_LINK_LIBRARIES(char_const*,cmMakefile*)::keys._184_8_ = 0;
          cmsys::RegularExpression::compile
                    ((RegularExpression *)
                     cmTargetCheckINTERFACE_LINK_LIBRARIES(char_const*,cmMakefile*)::keys,
                     "(^|;)(debug|optimized|general)(;|$)");
          __cxa_atexit(cmsys::RegularExpression::~RegularExpression,
                       cmTargetCheckINTERFACE_LINK_LIBRARIES(char_const*,cmMakefile*)::keys,
                       &__dso_handle);
          __cxa_guard_release(&cmTargetCheckINTERFACE_LINK_LIBRARIES(char_const*,cmMakefile*)::keys)
          ;
        }
      }
      bVar1 = cmsys::RegularExpression::find
                        ((RegularExpression *)
                         cmTargetCheckINTERFACE_LINK_LIBRARIES(char_const*,cmMakefile*)::keys,pcVar3
                        );
      if (bVar1) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_190);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_190,
                   "Property INTERFACE_LINK_LIBRARIES may not contain link-type keyword \"",0x45);
        if (cmTargetCheckINTERFACE_LINK_LIBRARIES(char_const*,cmMakefile*)::keys._16_8_ == 0) {
          local_1b0._M_dataplus._M_p = (pointer)&local_1b0.field_2;
          local_1b0._M_string_length = 0;
          local_1b0.field_2._M_local_buf[0] = '\0';
        }
        else {
          local_1b0._M_dataplus._M_p = (pointer)&local_1b0.field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_1b0,
                     cmTargetCheckINTERFACE_LINK_LIBRARIES(char_const*,cmMakefile*)::keys._16_8_,
                     cmTargetCheckINTERFACE_LINK_LIBRARIES(char_const*,cmMakefile*)::keys._96_8_);
        }
        poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)local_190,local_1b0._M_dataplus._M_p,
                            local_1b0._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar4,
                   "\".  The INTERFACE_LINK_LIBRARIES property may contain configuration-sensitive generator-expressions which may be used to specify per-configuration rules."
                   ,0x99);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1b0._M_dataplus._M_p != &local_1b0.field_2) {
          operator_delete(local_1b0._M_dataplus._M_p,
                          CONCAT71(local_1b0.field_2._M_allocated_capacity._1_7_,
                                   local_1b0.field_2._M_local_buf[0]) + 1);
        }
        std::__cxx11::stringbuf::str();
        cmMakefile::IssueMessage(context,FATAL_ERROR,&local_1b0);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1b0._M_dataplus._M_p != &local_1b0.field_2) {
          operator_delete(local_1b0._M_dataplus._M_p,
                          CONCAT71(local_1b0.field_2._M_allocated_capacity._1_7_,
                                   local_1b0.field_2._M_local_buf[0]) + 1);
        }
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_190);
        std::ios_base::~ios_base((ios_base *)(local_190 + 0x70));
      }
    }
  }
  return;
}

Assistant:

void cmTarget::CheckProperty(const std::string& prop,
                             cmMakefile* context) const
{
  // Certain properties need checking.
  if (cmHasLiteralPrefix(prop, "LINK_INTERFACE_LIBRARIES")) {
    if (const char* value = this->GetProperty(prop)) {
      cmTargetCheckLINK_INTERFACE_LIBRARIES(prop, value, context, false);
    }
  }
  if (cmHasLiteralPrefix(prop, "IMPORTED_LINK_INTERFACE_LIBRARIES")) {
    if (const char* value = this->GetProperty(prop)) {
      cmTargetCheckLINK_INTERFACE_LIBRARIES(prop, value, context, true);
    }
  }
  if (cmHasLiteralPrefix(prop, "INTERFACE_LINK_LIBRARIES")) {
    if (const char* value = this->GetProperty(prop)) {
      cmTargetCheckINTERFACE_LINK_LIBRARIES(value, context);
    }
  }
}